

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O2

void google::protobuf::compiler::php::GenerateEnumFile
               (FileDescriptor *file,EnumDescriptor *en,bool is_descriptor,
               GeneratorContext *generator_context)

{
  EnumValueDescriptor *value;
  long lVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  int32 value_00;
  undefined7 in_register_00000011;
  long lVar4;
  string local_160;
  long local_140;
  string fullname;
  string filename;
  Printer printer;
  string local_70;
  string local_50;
  ZeroCopyOutputStream *output;
  
  GeneratedEnumFileName_abi_cxx11_
            (&filename,(php *)en,(EnumDescriptor *)CONCAT71(in_register_00000011,is_descriptor),
             SUB81(generator_context,0));
  iVar2 = (*generator_context->_vptr_GeneratorContext[2])(generator_context,&filename);
  output = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar2);
  io::Printer::Printer(&printer,output,'^');
  GenerateHead(file,&printer);
  FilenameToClassname(&fullname,&filename);
  iVar2 = std::__cxx11::string::find_last_of((char *)&fullname,0x3440e9);
  if (*(long *)(*(long *)(file + 8) + 8) != 0) {
    std::__cxx11::string::substr((ulong)&local_160,(ulong)&fullname);
    io::Printer::Print(&printer,"namespace ^name^;\n\n","name",&local_160);
    std::__cxx11::string::~string((string *)&local_160);
  }
  GenerateEnumDocComment(&printer,en);
  if (iVar2 == -1) {
    io::Printer::Print(&printer,"class ^name^\n{\n","name",&fullname);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_160,(ulong)&fullname);
    io::Printer::Print(&printer,"class ^name^\n{\n","name",&local_160);
    std::__cxx11::string::~string((string *)&local_160);
  }
  Indent(&printer);
  lVar3 = 0;
  lVar4 = 0;
  while (lVar4 < *(int *)(en + 0x2c)) {
    lVar1 = *(long *)(en + 0x30);
    value = (EnumValueDescriptor *)(lVar1 + lVar3);
    local_140 = lVar4;
    GenerateEnumValueDocComment(&printer,value);
    ClassNamePrefix<google::protobuf::EnumDescriptor>(&local_50,*(string **)value,en);
    std::operator+(&local_160,&local_50,
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)value);
    IntToString_abi_cxx11_(&local_70,(php *)(ulong)*(uint *)(lVar1 + 0x10 + lVar3),value_00);
    io::Printer::Print(&printer,"const ^name^ = ^number^;\n","name",&local_160,"number",&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_160);
    std::__cxx11::string::~string((string *)&local_50);
    lVar3 = lVar3 + 0x28;
    lVar4 = local_140 + 1;
  }
  Outdent(&printer);
  io::Printer::Print(&printer,"}\n\n");
  std::__cxx11::string::~string((string *)&fullname);
  io::Printer::~Printer(&printer);
  if (output != (ZeroCopyOutputStream *)0x0) {
    (*output->_vptr_ZeroCopyOutputStream[1])(output);
  }
  std::__cxx11::string::~string((string *)&filename);
  return;
}

Assistant:

void GenerateEnumFile(const FileDescriptor* file, const EnumDescriptor* en,
                      bool is_descriptor, GeneratorContext* generator_context) {
  std::string filename = GeneratedEnumFileName(en, is_descriptor);
  scoped_ptr<io::ZeroCopyOutputStream> output(
      generator_context->Open(filename));
  io::Printer printer(output.get(), '^');

  GenerateHead(file, &printer);

  std::string fullname = FilenameToClassname(filename);
  int lastindex = fullname.find_last_of("\\");

  if (!file->package().empty()) {
    printer.Print(
        "namespace ^name^;\n\n",
        "name", fullname.substr(0, lastindex));
  }

  GenerateEnumDocComment(&printer, en);

  if (lastindex != string::npos) {
    printer.Print(
        "class ^name^\n"
        "{\n",
        "name", fullname.substr(lastindex + 1));
  } else {
    printer.Print(
        "class ^name^\n"
        "{\n",
        "name", fullname);
  }
  Indent(&printer);

  for (int i = 0; i < en->value_count(); i++) {
    const EnumValueDescriptor* value = en->value(i);
    GenerateEnumValueDocComment(&printer, value);
    printer.Print("const ^name^ = ^number^;\n",
                  "name", ClassNamePrefix(value->name(), en) + value->name(),
                  "number", IntToString(value->number()));
  }

  Outdent(&printer);
  printer.Print("}\n\n");
}